

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall
Json::OurReader::getLocationLineAndColumn(OurReader *this,Location location,int *line,int *column)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *pcStack_38;
  Char c;
  Location lastLineStart;
  Location current;
  int *column_local;
  int *line_local;
  Location location_local;
  OurReader *this_local;
  
  pcStack_38 = this->begin_;
  *line = 0;
  lastLineStart = pcStack_38;
  while( true ) {
    bVar3 = false;
    if (lastLineStart < location) {
      bVar3 = lastLineStart != this->end_;
    }
    if (!bVar3) break;
    pcVar2 = lastLineStart + 1;
    cVar1 = *lastLineStart;
    if (cVar1 == '\r') {
      if (*pcVar2 == '\n') {
        pcVar2 = lastLineStart + 2;
      }
      lastLineStart = pcVar2;
      pcStack_38 = lastLineStart;
      *line = *line + 1;
    }
    else {
      lastLineStart = pcVar2;
      if (cVar1 == '\n') {
        *line = *line + 1;
        pcStack_38 = pcVar2;
      }
    }
  }
  *column = ((int)location - (int)pcStack_38) + 1;
  *line = *line + 1;
  return;
}

Assistant:

void OurReader::getLocationLineAndColumn(Location location, int& line,
                                         int& column) const {
  Location current = begin_;
  Location lastLineStart = current;
  line = 0;
  while (current < location && current != end_) {
    Char c = *current++;
    if (c == '\r') {
      if (*current == '\n')
        ++current;
      lastLineStart = current;
      ++line;
    } else if (c == '\n') {
      lastLineStart = current;
      ++line;
    }
  }
  // column & line start at 1
  column = int(location - lastLineStart) + 1;
  ++line;
}